

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::CheckCMP0004(string *__return_storage_ptr__,cmGeneratorTarget *this,string *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  cmake *this_00;
  ostream *poVar4;
  string *psVar5;
  PolicyID id;
  PolicyID id_00;
  undefined1 local_1d0 [16];
  string local_1c0;
  ostringstream e;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)item);
  lVar3 = std::__cxx11::string::find_first_not_of((char *)__return_storage_ptr__,0x430a0a);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&e,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  lVar3 = std::__cxx11::string::find_last_not_of((char *)__return_storage_ptr__,0x430a0a);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&e,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  bVar1 = std::operator!=(__return_storage_ptr__,item);
  if (bVar1) {
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    PVar2 = GetPolicyStatusCMP0004(this);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_
                ((string *)(local_1d0 + 0x10),(cmPolicies *)0x4,id);
      poVar4 = std::operator<<((ostream *)&e,(string *)(local_1d0 + 0x10));
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"Target \"");
      psVar5 = GetName_abi_cxx11_(this);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" links to item \"");
      poVar4 = std::operator<<(poVar4,(string *)item);
      std::operator<<(poVar4,"\" which has leading or trailing whitespace.");
      std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1d0);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                          (cmListFileBacktrace *)local_1d0);
    }
    else if (PVar2 == WARN) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)(local_1d0 + 0x10),(cmPolicies *)0x4,id_00);
      poVar4 = std::operator<<((ostream *)&e,(string *)(local_1d0 + 0x10));
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"Target \"");
      psVar5 = GetName_abi_cxx11_(this);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" links to item \"");
      poVar4 = std::operator<<(poVar4,(string *)item);
      std::operator<<(poVar4,"\" which has leading or trailing whitespace.");
      std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1d0);
      cmake::IssueMessage(this_00,AUTHOR_WARNING,(string *)(local_1d0 + 0x10),
                          (cmListFileBacktrace *)local_1d0);
    }
    else {
      if (PVar2 != NEW) {
        return __return_storage_ptr__;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Target \"");
      psVar5 = GetName_abi_cxx11_(this);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" links to item \"");
      poVar4 = std::operator<<(poVar4,(string *)item);
      poVar4 = std::operator<<(poVar4,"\" which has leading or trailing whitespace.  ");
      std::operator<<(poVar4,"This is now an error according to policy CMP0004.");
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1d0);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                          (cmListFileBacktrace *)local_1d0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
    std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CheckCMP0004(std::string const& item) const
{
  // Strip whitespace off the library names because we used to do this
  // in case variables were expanded at generate time.  We no longer
  // do the expansion but users link to libraries like " ${VAR} ".
  std::string lib = item;
  std::string::size_type pos = lib.find_first_not_of(" \t\r\n");
  if (pos != std::string::npos) {
    lib = lib.substr(pos);
  }
  pos = lib.find_last_not_of(" \t\r\n");
  if (pos != std::string::npos) {
    lib = lib.substr(0, pos + 1);
  }
  if (lib != item) {
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    switch (this->GetPolicyStatusCMP0004()) {
      case cmPolicies::WARN: {
        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0004) << "\n"
          << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.";
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                         this->GetBacktrace());
      }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW: {
        std::ostringstream e;
        e << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.  "
          << "This is now an error according to policy CMP0004.";
        cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                         this->GetBacktrace());
      } break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0004) << "\n"
          << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.";
        cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                         this->GetBacktrace());
      } break;
    }
  }
  return lib;
}